

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDefines.h
# Opt level: O3

void __thiscall
KDIS::KException::KException<std::__cxx11::string>
          (KException *this,KString *Text,KUINT16 EC,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *AdditonalInfo)

{
  ostream *poVar1;
  undefined8 uVar2;
  size_type __dnew;
  KStringStream ss;
  long local_1e8;
  char *local_1e0;
  long local_1d8;
  undefined5 local_1d0;
  undefined1 uStack_1cb;
  undefined1 uStack_1ca;
  undefined4 uStack_1c9;
  undefined1 uStack_1c5;
  undefined1 uStack_1c4;
  undefined1 uStack_1c3;
  undefined1 local_1c2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  *(undefined ***)this = &PTR__KException_00221b98;
  this->m_ui16ErrorCode = EC;
  local_1c0 = &(this->m_sErrorText).field_2;
  (this->m_sErrorText)._M_dataplus._M_p = (pointer)local_1c0;
  (this->m_sErrorText)._M_string_length = 0;
  (this->m_sErrorText).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream(local_1b8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,(Text->_M_dataplus)._M_p,Text->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
  local_1e0 = (char *)&local_1d0;
  switch(EC) {
  case 0:
    local_1d0 = 0x7245206f4e;
    uStack_1cb = 0x72;
    uStack_1ca = 0x6f;
    uStack_1c9 = 0x202e7372;
    local_1d8 = 0xb;
    uStack_1c5 = 0;
    goto LAB_001313cc;
  case 1:
    local_1e8 = 0x15;
    local_1e0 = (char *)std::__cxx11::string::_M_create((ulong *)&local_1e0,(ulong)&local_1e8);
    local_1d0 = (undefined5)local_1e8;
    uStack_1cb = (undefined1)((ulong)local_1e8 >> 0x28);
    uStack_1ca = (undefined1)((ulong)local_1e8 >> 0x30);
    uStack_1c9._0_1_ = (undefined1)((ulong)local_1e8 >> 0x38);
    builtin_strncpy(local_1e0,"Buffer Is Too Sm",0x10);
    uVar2 = 0x202e6c6c616d5320;
    goto LAB_001312b2;
  case 2:
    local_1e8 = 0x36;
    local_1e0 = (char *)std::__cxx11::string::_M_create((ulong *)&local_1e0,(ulong)&local_1e8);
    local_1d0 = (undefined5)local_1e8;
    uStack_1cb = (undefined1)((ulong)local_1e8 >> 0x28);
    uStack_1ca = (undefined1)((ulong)local_1e8 >> 0x30);
    uStack_1c9._0_1_ = (undefined1)((ulong)local_1e8 >> 0x38);
    builtin_strncpy(local_1e0,"Buffer Does Not Contain Enough Information To Decode. ",0x36);
    break;
  case 3:
    local_1e8 = 0x15;
    local_1e0 = (char *)std::__cxx11::string::_M_create((ulong *)&local_1e0,(ulong)&local_1e8);
    local_1d0 = (undefined5)local_1e8;
    uStack_1cb = (undefined1)((ulong)local_1e8 >> 0x28);
    uStack_1ca = (undefined1)((ulong)local_1e8 >> 0x30);
    uStack_1c9._0_1_ = (undefined1)((ulong)local_1e8 >> 0x38);
    builtin_strncpy(local_1e0,"String Size Too ",0x10);
    uVar2 = 0x202e676942206f6f;
LAB_001312b2:
    *(undefined8 *)(local_1e0 + 0xd) = uVar2;
    break;
  case 4:
    local_1e8 = 0x18;
    local_1e0 = (char *)std::__cxx11::string::_M_create((ulong *)&local_1e0,(ulong)&local_1e8);
    local_1d0 = (undefined5)local_1e8;
    uStack_1cb = (undefined1)((ulong)local_1e8 >> 0x28);
    uStack_1ca = (undefined1)((ulong)local_1e8 >> 0x30);
    uStack_1c9._0_1_ = (undefined1)((ulong)local_1e8 >> 0x38);
    builtin_strncpy(local_1e0,"Data Type Is Too Large. ",0x18);
    break;
  case 5:
    local_1e8 = 0x28;
    local_1e0 = (char *)std::__cxx11::string::_M_create((ulong *)&local_1e0,(ulong)&local_1e8);
    local_1d0 = (undefined5)local_1e8;
    uStack_1cb = (undefined1)((ulong)local_1e8 >> 0x28);
    uStack_1ca = (undefined1)((ulong)local_1e8 >> 0x30);
    uStack_1c9._0_1_ = (undefined1)((ulong)local_1e8 >> 0x38);
    builtin_strncpy(local_1e0,"Incorrect PDU Type Specified In Header. ",0x28);
    break;
  case 6:
    local_1e8 = 0x29;
    local_1e0 = (char *)std::__cxx11::string::_M_create((ulong *)&local_1e0,(ulong)&local_1e8);
    local_1d0 = (undefined5)local_1e8;
    uStack_1cb = (undefined1)((ulong)local_1e8 >> 0x28);
    uStack_1ca = (undefined1)((ulong)local_1e8 >> 0x30);
    uStack_1c9._0_1_ = (undefined1)((ulong)local_1e8 >> 0x38);
    builtin_strncpy(local_1e0,"Could Not Open File For Reading/Writing. ",0x29);
    break;
  case 7:
    local_1e8 = 0x37;
    local_1e0 = (char *)std::__cxx11::string::_M_create((ulong *)&local_1e0,(ulong)&local_1e8);
    local_1d0 = (undefined5)local_1e8;
    uStack_1cb = (undefined1)((ulong)local_1e8 >> 0x28);
    uStack_1ca = (undefined1)((ulong)local_1e8 >> 0x30);
    uStack_1c9._0_1_ = (undefined1)((ulong)local_1e8 >> 0x38);
    builtin_strncpy(local_1e0,"Parameter Is Out Of Bounds/Range Of Acceptable Values. ",0x37);
    break;
  case 8:
    uStack_1c5 = 0x61;
    uStack_1c4 = 0x2e;
    uStack_1c3 = 0x20;
    local_1d0 = 0x6c61766e49;
    uStack_1cb = 0x69;
    uStack_1ca = 100;
    uStack_1c9 = 0x74614420;
    local_1d8 = 0xe;
    local_1c2 = 0;
    goto LAB_001313cc;
  case 9:
    local_1e8 = 0x27;
    local_1e0 = (char *)std::__cxx11::string::_M_create((ulong *)&local_1e0,(ulong)&local_1e8);
    local_1d0 = (undefined5)local_1e8;
    uStack_1cb = (undefined1)((ulong)local_1e8 >> 0x28);
    uStack_1ca = (undefined1)((ulong)local_1e8 >> 0x30);
    uStack_1c9._0_1_ = (undefined1)((ulong)local_1e8 >> 0x38);
    builtin_strncpy(local_1e0,"Unsupported Data Type, Can Not Decode. ",0x27);
    break;
  case 10:
    local_1e8 = 0x13;
    local_1e0 = (char *)std::__cxx11::string::_M_create((ulong *)&local_1e0,(ulong)&local_1e8);
    local_1d0 = (undefined5)local_1e8;
    uStack_1cb = (undefined1)((ulong)local_1e8 >> 0x28);
    uStack_1ca = (undefined1)((ulong)local_1e8 >> 0x30);
    uStack_1c9._0_1_ = (undefined1)((ulong)local_1e8 >> 0x38);
    builtin_strncpy(local_1e0,"Invalid Operation. ",0x13);
    break;
  case 0xb:
    local_1e8 = 0x31;
    local_1e0 = (char *)std::__cxx11::string::_M_create((ulong *)&local_1e0,(ulong)&local_1e8);
    local_1d0 = (undefined5)local_1e8;
    uStack_1cb = (undefined1)((ulong)local_1e8 >> 0x28);
    uStack_1ca = (undefined1)((ulong)local_1e8 >> 0x30);
    uStack_1c9._0_1_ = (undefined1)((ulong)local_1e8 >> 0x38);
    builtin_strncpy(local_1e0,"PDU Is Too Large. PDU Must Not Exceed 8192 Bytes.",0x31);
    break;
  case 0xc:
    uStack_1c5 = 0x72;
    uStack_1c4 = 0x2e;
    local_1d0 = 0x656b636f53;
    uStack_1cb = 0x74;
    uStack_1ca = 0x20;
    uStack_1c9 = 0x6f727265;
    local_1d8 = 0xd;
    uStack_1c3 = 0;
    goto LAB_001313cc;
  default:
    local_1e8 = 0x14;
    local_1e0 = (char *)std::__cxx11::string::_M_create((ulong *)&local_1e0,(ulong)&local_1e8);
    local_1d0 = (undefined5)local_1e8;
    uStack_1cb = (undefined1)((ulong)local_1e8 >> 0x28);
    uStack_1ca = (undefined1)((ulong)local_1e8 >> 0x30);
    uStack_1c9._0_1_ = (undefined1)((ulong)local_1e8 >> 0x38);
    builtin_strncpy(local_1e0,"Unknown KDIS Error. ",0x14);
  }
  local_1e0[local_1e8] = '\0';
  local_1d8 = local_1e8;
LAB_001313cc:
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_1e0,local_1d8);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->m_sErrorText)._M_dataplus._M_p,
                      (this->m_sErrorText)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(AdditonalInfo->_M_dataplus)._M_p,AdditonalInfo->_M_string_length);
  if (local_1e0 != (char *)&local_1d0) {
    operator_delete(local_1e0,
                    CONCAT17((undefined1)uStack_1c9,
                             CONCAT16(uStack_1ca,CONCAT15(uStack_1cb,local_1d0))) + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->m_sErrorText,(string *)&local_1e0);
  if (local_1e0 != (char *)&local_1d0) {
    operator_delete(local_1e0,
                    CONCAT17((undefined1)uStack_1c9,
                             CONCAT16(uStack_1ca,CONCAT15(uStack_1cb,local_1d0))) + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

KException(const KString &Text, KUINT16 EC, T AdditonalInfo) :
        m_ui16ErrorCode( EC )
    {
        KStringStream ss;
        ss << Text << ": " << GetErrorText( EC ) << m_sErrorText << AdditonalInfo;
        m_sErrorText = ss.str();
    }